

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<RCCFileInfo::DeduplicationKey,RCCFileInfo*>::emplace<RCCFileInfo*const&>
          (iterator *__return_storage_ptr__,void *this,DeduplicationKey *key,RCCFileInfo **args)

{
  long in_FS_OFFSET;
  DeduplicationKey local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.compressThreshold = key->compressThreshold;
  local_40.compressAlgo = key->compressAlgo;
  local_40.compressLevel = key->compressLevel;
  local_40.hash.d.d = (key->hash).d.d;
  local_40.hash.d.ptr = (key->hash).d.ptr;
  local_40.hash.d.size = (key->hash).d.size;
  if (&(local_40.hash.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_40.hash.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_40.hash.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  emplace<RCCFileInfo*const&>(__return_storage_ptr__,this,&local_40,args);
  if (&(local_40.hash.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.hash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.hash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.hash.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.hash.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        return emplace(Key(key), std::forward<Args>(args)...);
    }